

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O0

fy_token * fy_token_alloc(void)

{
  fy_token *__s;
  uint local_1c;
  uint i;
  fy_token *fyt;
  
  __s = (fy_token *)malloc(0x130);
  if (__s != (fy_token *)0x0) {
    memset(__s,0,0x130);
    __s->type = FYTT_NONE;
    __s->analyze_flags = 0;
    __s->text_len = 0;
    __s->text = (char *)0x0;
    __s->text0 = (char *)0x0;
    (__s->handle).fyi = (fy_input *)0x0;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      __s->comment[local_1c].fyi = (fy_input *)0x0;
    }
    __s->refs = 1;
  }
  return __s;
}

Assistant:

struct fy_token *fy_token_alloc(void) {
    struct fy_token *fyt;
    unsigned int i;

    fyt = malloc(sizeof(*fyt));
    if (!fyt)
        return fyt;

    memset(fyt, 0, sizeof(*fyt));

    fyt->type = FYTT_NONE;
    fyt->analyze_flags = 0;
    fyt->text_len = 0;
    fyt->text = NULL;
    fyt->text0 = NULL;
    fyt->handle.fyi = NULL;
    for (i = 0; i < sizeof(fyt->comment) / sizeof(fyt->comment[0]); i++)
        fyt->comment[i].fyi = NULL;

    fyt->refs = 1;

    return fyt;
}